

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilerBuffer.cpp
# Opt level: O3

void __thiscall helics::ProfilerBuffer::writeFile(ProfilerBuffer *this)

{
  long lVar1;
  pointer pbVar2;
  ostream *poVar3;
  char *pcVar4;
  int *piVar5;
  error_code *peVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *m;
  pointer __pos;
  ofstream file;
  undefined4 local_238 [2];
  undefined8 local_230;
  long local_228;
  filebuf local_220 [20];
  byte abStack_20c [4];
  uint auStack_208 [54];
  ios_base local_130 [264];
  
  std::ofstream::ofstream((string *)&local_228);
  std::ofstream::open((string *)&local_228,(int)this + (_S_out|_S_in));
  lVar1 = *(long *)(local_228 + -0x18);
  if ((*(uint *)((long)auStack_208 + lVar1) & 5) == 0) {
    abStack_20c[lVar1] = abStack_20c[lVar1] | 5;
    std::ios::clear((int)local_238 + (int)lVar1 + 0x10);
    __pos = (this->mBuffers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->mBuffers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__pos != pbVar2) {
      do {
        if (__pos->_M_string_length != 0) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_228,(__pos->_M_dataplus)._M_p,
                              __pos->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        __pos->_M_string_length = 0;
        *(__pos->_M_dataplus)._M_p = '\0';
        __pos = __pos + 1;
      } while (__pos != pbVar2);
      __pos = (this->mBuffers).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    }
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->mBuffers,__pos);
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _pthread_mutex_unlock;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
    return;
  }
  pcVar4 = (char *)__cxa_allocate_exception(0x20);
  piVar5 = __errno_location();
  peVar6 = (error_code *)strerror(*piVar5);
  local_230 = std::iostream_category();
  local_238[0] = 1;
  std::ios_base::failure[abi:cxx11]::failure(pcVar4,peVar6);
  __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

void ProfilerBuffer::writeFile()
{
    std::ofstream file;
    // can't enable exception now because of gcc bug that raises ios_base::failure with useless
    // message file.exceptions(file.exceptions() | std::ios::failbit);
    file.open(mFileName, std::ios::out | std::ios::app);
    if (file.fail()) {
        throw std::ios_base::failure(std::strerror(errno));
    }

    // make sure write fails with exception if something is wrong
    file.exceptions(file.exceptions() | std::ios::failbit | std::ifstream::badbit);

    for (auto& m : mBuffers) {
        if (!m.empty()) {
            file << m << std::endl;
        }
        m.clear();
    }
    mBuffers.clear();
}